

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFYAML.cpp
# Opt level: O3

void llvm::yaml::MappingTraits<llvm::DWARFYAML::AttributeAbbrev>::mapping
               (IO *IO,AttributeAbbrev *AttAbbrev)

{
  EmptyContext local_1b;
  EmptyContext local_1a;
  EmptyContext local_19 [6];
  EmptyContext Ctx_2;
  EmptyContext Ctx_1;
  EmptyContext Ctx;
  
  yaml::IO::processKey<llvm::dwarf::Attribute,llvm::yaml::EmptyContext>
            (IO,"Attribute",&AttAbbrev->Attribute,true,local_19);
  yaml::IO::processKey<llvm::dwarf::Form,llvm::yaml::EmptyContext>
            (IO,"Form",&AttAbbrev->Form,true,&local_1a);
  if (AttAbbrev->Form == DW_FORM_implicit_const) {
    yaml::IO::processKey<llvm::yaml::Hex64,llvm::yaml::EmptyContext>
              (IO,"Value",&AttAbbrev->Value,true,&local_1b);
  }
  return;
}

Assistant:

void MappingTraits<DWARFYAML::AttributeAbbrev>::mapping(
    IO &IO, DWARFYAML::AttributeAbbrev &AttAbbrev) {
  IO.mapRequired("Attribute", AttAbbrev.Attribute);
  IO.mapRequired("Form", AttAbbrev.Form);
  if(AttAbbrev.Form == dwarf::DW_FORM_implicit_const)
    IO.mapRequired("Value", AttAbbrev.Value);
}